

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.hpp
# Opt level: O0

RenderbufferAttachment * __thiscall
deqp::gls::FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::RenderbufferAttachment>
          (FboBuilder *this)

{
  RenderbufferAttachment *this_00;
  RenderbufferAttachment *local_30 [3];
  RenderbufferAttachment *local_18;
  RenderbufferAttachment *cfg;
  FboBuilder *this_local;
  
  cfg = (RenderbufferAttachment *)this;
  this_00 = (RenderbufferAttachment *)operator_new(0x18);
  FboUtil::config::RenderbufferAttachment::RenderbufferAttachment(this_00);
  local_30[0] = this_00;
  local_18 = this_00;
  std::
  set<deqp::gls::FboUtil::config::Config_*,_std::less<deqp::gls::FboUtil::config::Config_*>,_std::allocator<deqp::gls::FboUtil::config::Config_*>_>
  ::insert(&this->m_configs,(value_type *)local_30);
  return local_18;
}

Assistant:

Config&						makeConfig		(void)
	{
		Config* cfg = new Config();
		m_configs.insert(cfg);
		return *cfg;
	}